

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void leaks_with_empty(_Bool copy_on_write)

{
  _Bool _Var1;
  roaring_bitmap_t *x2;
  roaring_bitmap_t *r;
  roaring_bitmap_t *r1;
  roaring_bitmap_t *r1_00;
  roaring_bitmap_t *r_00;
  roaring_bitmap_t *r1_01;
  uint32_t val;
  
  x2 = roaring_bitmap_create_with_capacity(0);
  (x2->high_low_container).flags = (x2->high_low_container).flags & 0xfe | copy_on_write;
  r = roaring_bitmap_create_with_capacity(0);
  (r->high_low_container).flags = (r->high_low_container).flags & 0xfe | copy_on_write;
  val = 0x61;
  do {
    val = val + 3;
    roaring_bitmap_add(r,val);
  } while (val < 0x1116d);
  r1 = roaring_bitmap_or(r,x2);
  r1_00 = roaring_bitmap_xor(r,x2);
  r_00 = roaring_bitmap_and(r,x2);
  r1_01 = roaring_bitmap_andnot(r,x2);
  roaring_bitmap_free(x2);
  _Var1 = roaring_bitmap_equals(r1,r);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(ror, r1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x24a);
  roaring_bitmap_free(r1);
  _Var1 = roaring_bitmap_equals(r1_00,r);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(rxor, r1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x24c);
  roaring_bitmap_free(r1_00);
  _Var1 = roaring_bitmap_equals(r1_01,r);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(randnot, r1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x24e);
  roaring_bitmap_free(r1_01);
  roaring_bitmap_free(r);
  _Var1 = roaring_bitmap_is_empty(r_00);
  _assert_true((ulong)_Var1,"roaring_bitmap_is_empty(rand)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x251);
  roaring_bitmap_free(r_00);
  return;
}

Assistant:

void leaks_with_empty(bool copy_on_write) {
    roaring_bitmap_t *empty = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(empty, copy_on_write);
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    for (uint32_t i = 100; i < 70000; i += 3) {
        roaring_bitmap_add(r1, i);
    }
    roaring_bitmap_t *ror = roaring_bitmap_or(r1, empty);
    roaring_bitmap_t *rxor = roaring_bitmap_xor(r1, empty);
    roaring_bitmap_t *rand = roaring_bitmap_and(r1, empty);
    roaring_bitmap_t *randnot = roaring_bitmap_andnot(r1, empty);
    roaring_bitmap_free(empty);
    assert_true(roaring_bitmap_equals(ror, r1));
    roaring_bitmap_free(ror);
    assert_true(roaring_bitmap_equals(rxor, r1));
    roaring_bitmap_free(rxor);
    assert_true(roaring_bitmap_equals(randnot, r1));
    roaring_bitmap_free(randnot);
    roaring_bitmap_free(r1);
    assert_true(roaring_bitmap_is_empty(rand));
    roaring_bitmap_free(rand);
}